

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function-c.cpp
# Opt level: O2

void duckdb_destroy_cast_function(duckdb_cast_function *cast_function)

{
  CCastFunction *this;
  
  if ((cast_function != (duckdb_cast_function *)0x0) &&
     (this = (CCastFunction *)*cast_function, this != (CCastFunction *)0x0)) {
    duckdb::CCastFunction::~CCastFunction(this);
    operator_delete(this);
    *cast_function = (duckdb_cast_function)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_cast_function(duckdb_cast_function *cast_function) {
	if (!cast_function || !*cast_function) {
		return;
	}
	const auto function = reinterpret_cast<duckdb::CCastFunction *>(*cast_function);
	delete function;
	*cast_function = nullptr;
}